

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec-common.c
# Opt level: O1

void cpu_loop_exit_m68k(CPUState *cpu)

{
  if (cpu->uc->nested_level == 1) {
    tb_exec_unlock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
  }
  cpu->can_do_io = 1;
  siglongjmp((__jmp_buf_tag *)(cpu->uc->exits + (long)cpu->uc->nested_level * 0x19 + 0x33),1);
}

Assistant:

void cpu_loop_exit(CPUState *cpu)
{
    /* Unlock JIT write protect if applicable. */
    if (cpu->uc->nested_level == 1) {
        tb_exec_unlock(cpu->uc->tcg_ctx);
    }
    /* Undo the setting in cpu_tb_exec.  */
    cpu->can_do_io = 1;
    siglongjmp(cpu->uc->jmp_bufs[cpu->uc->nested_level - 1], 1);
}